

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MDLLoader.cpp
# Opt level: O1

void __thiscall Assimp::MDLImporter::InternReadFile_3DGS_MDL7(MDLImporter *this)

{
  undefined8 *puVar1;
  char *__s;
  int iVar2;
  int iVar3;
  int iVar4;
  aiScene *paVar5;
  void *pvVar6;
  undefined8 uVar7;
  Header_MDL7 *pHVar8;
  ai_uint32 aVar9;
  ulong *puVar10;
  Logger *pLVar11;
  aiMaterial *paVar12;
  aiNode *paVar13;
  aiMesh **ppaVar14;
  aiNode **ppaVar15;
  uint *puVar16;
  size_t sVar17;
  aiNode *this_00;
  int iVar18;
  pointer ppaVar19;
  uint uVar20;
  Header_MDL7 *pcHeader;
  MDLImporter *this_01;
  ulong uVar21;
  pointer ppaVar22;
  vector<aiMesh_*,_std::allocator<aiMesh_*>_> *pvVar23;
  aiNode *pcOldRoot;
  long lVar24;
  ulong uVar25;
  uchar *szCurrent;
  int iMode;
  IntSplitGroupData_MDL7 splitGroupData;
  IntSharedData_MDL7 sharedData;
  IntGroupInfo_MDL7 groupInfo;
  IntGroupData_MDL7 groupData;
  Header_MDL7 *local_510;
  uint local_504;
  value_type local_500;
  int local_4f4;
  vector<aiMesh_*,_std::allocator<aiMesh_*>_> *local_4f0;
  Header_MDL7 *local_4e8;
  IntSplitGroupData_MDL7 local_4e0;
  ulong *local_4c8;
  void *local_4c0;
  undefined1 local_4b8 [24];
  uint local_4a0;
  vector<aiMaterial_*,_std::allocator<aiMaterial_*>_> local_490;
  IntBone_MDL7 **local_478;
  _Alloc_hider local_468;
  undefined1 local_460 [24];
  Triangle_MDL7 *pTStack_448;
  Vertex_MDL7 *local_440;
  undefined1 local_438 [48];
  vector<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_> local_408;
  vector<unsigned_int,_std::allocator<unsigned_int>_> local_3f0;
  vector<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_> local_3d8;
  vector<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_> local_3c0;
  bool local_3a8;
  
  if (this->pScene == (aiScene *)0x0) {
    __assert_fail("__null != pScene",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/wbrbr[P]realtime/external/assimp/code/MDL/MDLLoader.cpp"
                  ,0x543,"void Assimp::MDLImporter::InternReadFile_3DGS_MDL7()");
  }
  this_01 = (MDLImporter *)local_4b8;
  MDL::IntSharedData_MDL7::IntSharedData_MDL7((IntSharedData_MDL7 *)this_01);
  pcHeader = (Header_MDL7 *)this->mBuffer;
  local_510 = pcHeader + 1;
  ValidateHeader_3DGS_MDL7(this_01,pcHeader);
  local_510 = (Header_MDL7 *)
              (local_510->ident + (uint)pcHeader->bone_stc_size * pcHeader->bones_num);
  local_478 = LoadBones_3DGS_MDL7(this);
  uVar25 = (ulong)pcHeader->groups_num;
  puVar10 = (ulong *)operator_new__(uVar25 * 0x18 + 8);
  *puVar10 = uVar25;
  pvVar23 = (vector<aiMesh_*,_std::allocator<aiMesh_*>_> *)(puVar10 + 1);
  if (uVar25 != 0) {
    memset(pvVar23,0,((uVar25 * 0x18 - 0x18) / 0x18) * 0x18 + 0x18);
  }
  uVar20 = pcHeader->groups_num;
  local_4f0 = pvVar23;
  if (uVar20 != 0) {
    uVar25 = 0;
    do {
      std::vector<aiMesh_*,_std::allocator<aiMesh_*>_>::reserve(pvVar23,3);
      uVar25 = uVar25 + 1;
      uVar20 = pcHeader->groups_num;
      pvVar23 = pvVar23 + 1;
    } while (uVar25 < uVar20);
  }
  local_468._M_p = (pointer)(ulong)(uVar20 << 4);
  local_4c0 = operator_new__((ulong)local_468._M_p);
  local_4e8 = pcHeader;
  local_4c8 = puVar10;
  if (pcHeader->groups_num != 0) {
    uVar25 = 0;
    do {
      pHVar8 = local_510;
      local_460._8_8_ = local_510;
      local_460._16_8_ = 0;
      pTStack_448 = (Triangle_MDL7 *)0x0;
      local_440 = (Vertex_MDL7 *)0x0;
      local_510 = (Header_MDL7 *)&local_510->bonetrans_stc_size;
      local_460._0_4_ = (uint)uVar25;
      SizeCheck(this,local_510,
                "/workspace/llm4binary/github/license_all_cmakelists_25/wbrbr[P]realtime/external/assimp/code/MDL/MDLLoader.cpp"
                ,0x577);
      if ((char)*(uint16_t *)pHVar8->ident != '\x01') {
        pLVar11 = DefaultLogger::get();
        Logger::warn(pLVar11,"[3DGS MDL7] Not a triangle mesh group. Continuing happily");
      }
      uVar21 = (ulong)((uint)uVar25 << 4);
      uVar7 = *(undefined8 *)&pHVar8->data_size;
      puVar1 = (undefined8 *)((long)local_4c0 + uVar21);
      *puVar1 = *(undefined8 *)&pHVar8->bones_num;
      puVar1[1] = uVar7;
      *(undefined1 *)((long)local_4c0 + uVar21 + 0xf) = 0;
      std::vector<aiMaterial_*,_std::allocator<aiMaterial_*>_>::reserve
                (&local_490,
                 (long)pHVar8->medlump_size +
                 ((long)local_490.super__Vector_base<aiMaterial_*,_std::allocator<aiMaterial_*>_>.
                        _M_impl.super__Vector_impl_data._M_finish -
                  (long)local_490.super__Vector_base<aiMaterial_*,_std::allocator<aiMaterial_*>_>.
                        _M_impl.super__Vector_impl_data._M_start >> 3));
      std::vector<bool,_std::allocator<bool>_>::resize
                ((vector<bool,_std::allocator<bool>_> *)local_4b8,
                 (long)pHVar8->medlump_size + (ulong)local_4a0 +
                 (local_4b8._16_8_ - local_4b8._0_8_) * 8,false);
      if (pHVar8->medlump_size != 0) {
        uVar20 = 0;
        do {
          ParseSkinLump_3DGS_MDL7(this,(uchar *)local_510,(uchar **)&local_510,&local_490);
          uVar20 = uVar20 + 1;
        } while (uVar20 < (uint)pHVar8->medlump_size);
      }
      if (local_490.super__Vector_base<aiMaterial_*,_std::allocator<aiMaterial_*>_>._M_impl.
          super__Vector_impl_data._M_start ==
          local_490.super__Vector_base<aiMaterial_*,_std::allocator<aiMaterial_*>_>._M_impl.
          super__Vector_impl_data._M_finish) {
        local_500.x = 2.8026e-45;
        paVar12 = (aiMaterial *)operator_new(0x10);
        aiMaterial::aiMaterial(paVar12);
        local_438._0_4_ = SUB84(paVar12,0);
        local_438._4_4_ = (undefined4)((ulong)paVar12 >> 0x20);
        if (local_490.super__Vector_base<aiMaterial_*,_std::allocator<aiMaterial_*>_>._M_impl.
            super__Vector_impl_data._M_finish ==
            local_490.super__Vector_base<aiMaterial_*,_std::allocator<aiMaterial_*>_>._M_impl.
            super__Vector_impl_data._M_end_of_storage) {
          std::vector<aiMaterial*,std::allocator<aiMaterial*>>::_M_realloc_insert<aiMaterial*>
                    ((vector<aiMaterial*,std::allocator<aiMaterial*>> *)&local_490,
                     (iterator)
                     local_490.super__Vector_base<aiMaterial_*,_std::allocator<aiMaterial_*>_>.
                     _M_impl.super__Vector_impl_data._M_finish,(aiMaterial **)local_438);
        }
        else {
          *local_490.super__Vector_base<aiMaterial_*,_std::allocator<aiMaterial_*>_>._M_impl.
           super__Vector_impl_data._M_finish = paVar12;
          local_490.super__Vector_base<aiMaterial_*,_std::allocator<aiMaterial_*>_>._M_impl.
          super__Vector_impl_data._M_finish =
               local_490.super__Vector_base<aiMaterial_*,_std::allocator<aiMaterial_*>_>._M_impl.
               super__Vector_impl_data._M_finish + 1;
        }
        paVar12 = *local_490.super__Vector_base<aiMaterial_*,_std::allocator<aiMaterial_*>_>._M_impl
                   .super__Vector_impl_data._M_start;
        aiMaterial::AddBinaryProperty(paVar12,&local_500,4,"$mat.shadingm",0,0,aiPTI_Integer);
        local_4e0.aiSplit =
             (vector<unsigned_int,_std::allocator<unsigned_int>_> **)0x3f19999a3f19999a;
        local_4e0.shared._0_4_ = 0x3f19999a;
        aiMaterial::AddBinaryProperty(paVar12,&local_4e0,0xc,"$clr.diffuse",0,0,aiPTI_Float);
        aiMaterial::AddBinaryProperty(paVar12,&local_4e0,0xc,"$clr.specular",0,0,aiPTI_Float);
        local_4e0.aiSplit =
             (vector<unsigned_int,_std::allocator<unsigned_int>_> **)0x3d4ccccd3d4ccccd;
        local_4e0.shared = (IntSharedData_MDL7 *)CONCAT44(local_4e0.shared._4_4_,0x3d4ccccd);
        aiMaterial::AddBinaryProperty(paVar12,&local_4e0,0xc,"$clr.ambient",0,0,aiPTI_Float);
        local_438._0_4_ = 0;
        local_438._4_4_ = local_438._4_4_ & 0xffffff00;
        memset(local_438 + 5,0x1b,0x3ff);
        local_438._0_4_ = 0xf;
        local_438[4] = 'D';
        local_438[5] = 'e';
        local_438[6] = 'f';
        local_438[7] = 'a';
        local_438[8] = 'u';
        local_438[9] = 'l';
        local_438[10] = 't';
        local_438[0xb] = 'M';
        local_438[0xc] = 'a';
        local_438[0xd] = 't';
        local_438[0xe] = 'e';
        local_438[0xf] = 'r';
        local_438[0x10] = 'i';
        local_438[0x11] = 'a';
        local_438[0x12] = 'l';
        local_438[0x13] = '\0';
        aiMaterial::AddProperty(paVar12,(aiString *)local_438,"?mat.name",0,0);
        std::vector<bool,_std::allocator<bool>_>::resize
                  ((vector<bool,_std::allocator<bool>_> *)local_4b8,1,false);
      }
      pcHeader = local_4e8;
      local_460._16_8_ = local_510;
      iVar18._0_2_ = pHVar8->bone_stc_size;
      iVar18._2_2_ = pHVar8->skin_stc_size;
      pTStack_448 = (Triangle_MDL7 *)
                    ((long)local_510->ident + (ulong)local_4e8->skinpoint_stc_size * (long)iVar18);
      iVar2._0_2_ = pHVar8->colorvalue_stc_size;
      iVar2._2_2_ = pHVar8->material_stc_size;
      local_440 = (Vertex_MDL7 *)
                  ((long)pTStack_448->v_index + (long)iVar2 * (ulong)local_4e8->triangle_stc_size);
      iVar3._0_2_ = pHVar8->skinpoint_stc_size;
      iVar3._2_2_ = pHVar8->triangle_stc_size;
      local_510 = (Header_MDL7 *)
                  ((long)&local_440->x + (ulong)local_4e8->mainvertex_stc_size * (long)iVar3);
      SizeCheck(this,local_510,
                "/workspace/llm4binary/github/license_all_cmakelists_25/wbrbr[P]realtime/external/assimp/code/MDL/MDLLoader.cpp"
                ,0x5c2);
      local_4e0.avOutList = local_4f0 + uVar25;
      local_4e0.aiSplit = (vector<unsigned_int,_std::allocator<unsigned_int>_> **)0x0;
      local_4e0.shared = (IntSharedData_MDL7 *)local_4b8;
      memset(local_438,0,0x91);
      if ((*(int *)&pHVar8->colorvalue_stc_size == 0) ||
         (iVar4._0_2_ = pHVar8->skinpoint_stc_size, iVar4._2_2_ = pHVar8->triangle_stc_size,
         iVar4 == 0)) {
        pLVar11 = DefaultLogger::get();
        Logger::warn(pLVar11,
                     "[3DGS MDL7] Mesh group consists of 0 vertices or faces. It will be skipped.");
      }
      else {
        uVar21 = (ulong)(uint)(*(int *)&pHVar8->colorvalue_stc_size * 3);
        std::vector<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>::resize
                  ((vector<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_> *)
                   (local_438 + 0x18),uVar21);
        std::vector<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>::resize
                  (&local_408,uVar21);
        if (local_478 != (IntBone_MDL7 **)0x0) {
          local_500.x = -NAN;
          std::vector<unsigned_int,_std::allocator<unsigned_int>_>::resize
                    (&local_3f0,uVar21,(value_type_conflict3 *)&local_500);
        }
        uVar7 = local_460._8_8_;
        if (*(int *)(local_460._8_8_ + 0x1c) != 0) {
          local_500.x = 0.0;
          local_500.y = 0.0;
          local_500.z = 0.0;
          std::vector<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>::resize
                    (&local_3d8,uVar21,&local_500);
          if (0x19 < local_4e8->triangle_stc_size) {
            local_500.x = 0.0;
            local_500.y = 0.0;
            local_500.z = 0.0;
            std::vector<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>::resize
                      (&local_3c0,uVar21,&local_500);
            local_3a8 = true;
          }
        }
        std::vector<Assimp::MDL::IntFace_MDL7,_std::allocator<Assimp::MDL::IntFace_MDL7>_>::resize
                  ((vector<Assimp::MDL::IntFace_MDL7,_std::allocator<Assimp::MDL::IntFace_MDL7>_> *)
                   local_438,(long)*(int *)(uVar7 + 0x20));
        ReadFaces_3DGS_MDL7(this,(IntGroupInfo_MDL7 *)local_460,(IntGroupData_MDL7 *)local_438);
        SortByMaterials_3DGS_MDL7
                  (this,(IntGroupInfo_MDL7 *)local_460,(IntGroupData_MDL7 *)local_438,&local_4e0);
        pcHeader = local_4e8;
        if (local_490.super__Vector_base<aiMaterial_*,_std::allocator<aiMaterial_*>_>._M_impl.
            super__Vector_impl_data._M_finish !=
            local_490.super__Vector_base<aiMaterial_*,_std::allocator<aiMaterial_*>_>._M_impl.
            super__Vector_impl_data._M_start) {
          uVar20 = 1;
          uVar21 = 0;
          do {
            if ((local_4e0.aiSplit[uVar21]->
                super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>)._M_impl.
                super__Vector_impl_data._M_start !=
                (local_4e0.aiSplit[uVar21]->
                super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>)._M_impl.
                super__Vector_impl_data._M_finish) {
              *(_func_int **)(local_4b8._0_8_ + (uVar21 >> 6) * 8) =
                   (_func_int *)
                   ((ulong)*(_func_int **)(local_4b8._0_8_ + (uVar21 >> 6) * 8) |
                   1L << ((byte)uVar21 & 0x3f));
            }
            uVar21 = (ulong)uVar20;
            uVar20 = uVar20 + 1;
          } while (uVar21 < (ulong)((long)local_490.
                                          super__Vector_base<aiMaterial_*,_std::allocator<aiMaterial_*>_>
                                          ._M_impl.super__Vector_impl_data._M_finish -
                                    (long)local_490.
                                          super__Vector_base<aiMaterial_*,_std::allocator<aiMaterial_*>_>
                                          ._M_impl.super__Vector_impl_data._M_start >> 3));
        }
      }
      ProcessFrames_3DGS_MDL7
                (this,(IntGroupInfo_MDL7 *)local_460,(IntGroupData_MDL7 *)local_438,
                 (IntSharedData_MDL7 *)local_4b8,(uchar *)local_510,(uchar **)&local_510);
      GenerateOutputMeshes_3DGS_MDL7(this,(IntGroupData_MDL7 *)local_438,&local_4e0);
      if (local_3c0.super__Vector_base<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>.
          _M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
        operator_delete(local_3c0.
                        super__Vector_base<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>.
                        _M_impl.super__Vector_impl_data._M_start);
      }
      if (local_3d8.super__Vector_base<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>.
          _M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
        operator_delete(local_3d8.
                        super__Vector_base<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>.
                        _M_impl.super__Vector_impl_data._M_start);
      }
      if (local_3f0.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
          super__Vector_impl_data._M_start != (pointer)0x0) {
        operator_delete(local_3f0.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                        _M_impl.super__Vector_impl_data._M_start);
      }
      if ((IOSystem *)
          local_408.super__Vector_base<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>.
          _M_impl.super__Vector_impl_data._M_start != (IOSystem *)0x0) {
        operator_delete(local_408.
                        super__Vector_base<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>.
                        _M_impl.super__Vector_impl_data._M_start);
      }
      if ((void *)local_438._24_8_ != (void *)0x0) {
        operator_delete((void *)local_438._24_8_);
      }
      if ((void *)CONCAT44(local_438._4_4_,local_438._0_4_) != (void *)0x0) {
        operator_delete((void *)CONCAT44(local_438._4_4_,local_438._0_4_));
      }
      MDL::IntSplitGroupData_MDL7::~IntSplitGroupData_MDL7(&local_4e0);
      uVar25 = uVar25 + 1;
    } while (uVar25 < pcHeader->groups_num);
  }
  paVar13 = (aiNode *)operator_new(0x478);
  puVar10 = local_4c8;
  aiNode::aiNode(paVar13);
  this->pScene->mRootNode = paVar13;
  if (pcHeader->groups_num != 0) {
    puVar10 = puVar10 + 2;
    uVar25 = 0;
    do {
      puVar16 = &this->pScene->mNumMeshes;
      *puVar16 = *puVar16 + (int)(*puVar10 - puVar10[-1] >> 3);
      uVar25 = uVar25 + 1;
      puVar10 = puVar10 + 3;
    } while (uVar25 < pcHeader->groups_num);
  }
  paVar5 = this->pScene;
  ppaVar14 = (aiMesh **)operator_new__((ulong)paVar5->mNumMeshes << 3);
  pvVar23 = local_4f0;
  paVar5->mMeshes = ppaVar14;
  if (pcHeader->groups_num != 0) {
    uVar25 = 0;
    iVar18 = 0;
    do {
      ppaVar19 = local_4f0[uVar25].super__Vector_base<aiMesh_*,_std::allocator<aiMesh_*>_>._M_impl.
                 super__Vector_impl_data._M_start;
      ppaVar22 = local_4f0[uVar25].super__Vector_base<aiMesh_*,_std::allocator<aiMesh_*>_>._M_impl.
                 super__Vector_impl_data._M_finish;
      if (ppaVar22 != ppaVar19) {
        uVar20 = 1;
        uVar21 = 0;
        do {
          this->pScene->mMeshes[(iVar18 + uVar20) - 1] = ppaVar19[uVar21];
          uVar21 = (ulong)uVar20;
          ppaVar19 = local_4f0[uVar25].super__Vector_base<aiMesh_*,_std::allocator<aiMesh_*>_>.
                     _M_impl.super__Vector_impl_data._M_start;
          ppaVar22 = local_4f0[uVar25].super__Vector_base<aiMesh_*,_std::allocator<aiMesh_*>_>.
                     _M_impl.super__Vector_impl_data._M_finish;
          uVar20 = uVar20 + 1;
        } while (uVar21 < (ulong)((long)ppaVar22 - (long)ppaVar19 >> 3));
        iVar18 = iVar18 + uVar20 + -1;
      }
      if (ppaVar19 != ppaVar22) {
        puVar16 = &this->pScene->mRootNode->mNumChildren;
        *puVar16 = *puVar16 + 1;
      }
      uVar25 = uVar25 + 1;
    } while (uVar25 < pcHeader->groups_num);
  }
  if (local_478 != (IntBone_MDL7 **)0x0) {
    puVar16 = &this->pScene->mRootNode->mNumChildren;
    *puVar16 = *puVar16 + 1;
  }
  paVar5 = this->pScene;
  ppaVar15 = (aiNode **)operator_new__((ulong)paVar5->mRootNode->mNumChildren << 3);
  paVar5->mRootNode->mChildren = ppaVar15;
  if (pcHeader->groups_num != 0) {
    uVar25 = 0;
    local_4f4 = 0;
    local_504 = 0;
    do {
      if (pvVar23[uVar25].super__Vector_base<aiMesh_*,_std::allocator<aiMesh_*>_>._M_impl.
          super__Vector_impl_data._M_start !=
          pvVar23[uVar25].super__Vector_base<aiMesh_*,_std::allocator<aiMesh_*>_>._M_impl.
          super__Vector_impl_data._M_finish) {
        paVar13 = (aiNode *)operator_new(0x478);
        uVar20 = local_504;
        aiNode::aiNode(paVar13);
        pvVar23 = pvVar23 + uVar25;
        this->pScene->mRootNode->mChildren[uVar20] = paVar13;
        uVar21 = (long)(pvVar23->super__Vector_base<aiMesh_*,_std::allocator<aiMesh_*>_>)._M_impl.
                       super__Vector_impl_data._M_finish -
                 (long)(pvVar23->super__Vector_base<aiMesh_*,_std::allocator<aiMesh_*>_>)._M_impl.
                       super__Vector_impl_data._M_start;
        paVar13->mNumMeshes = (uint)(uVar21 >> 3);
        puVar16 = (uint *)operator_new__(uVar21 >> 1 & 0x3fffffffc);
        uVar20 = local_504;
        paVar13->mMeshes = puVar16;
        paVar13->mParent = this->pScene->mRootNode;
        if (paVar13->mNumMeshes != 0) {
          uVar21 = 0;
          do {
            paVar13->mMeshes[uVar21] = local_4f4 + (int)uVar21;
            uVar21 = uVar21 + 1;
          } while (uVar21 < paVar13->mNumMeshes);
        }
        ppaVar19 = (pvVar23->super__Vector_base<aiMesh_*,_std::allocator<aiMesh_*>_>)._M_impl.
                   super__Vector_impl_data._M_finish;
        uVar21 = (ulong)(uint)((int)uVar25 << 4);
        __s = (char *)((long)local_4c0 + uVar21);
        ppaVar22 = (pvVar23->super__Vector_base<aiMesh_*,_std::allocator<aiMesh_*>_>)._M_impl.
                   super__Vector_impl_data._M_start;
        if (*(char *)((long)local_4c0 + uVar21) == '\0') {
          aVar9 = snprintf(__s,(long)local_468._M_p - uVar21,"Group_%u",(ulong)local_504);
        }
        else {
          sVar17 = strlen(__s);
          aVar9 = (ai_uint32)sVar17;
          uVar20 = local_504;
        }
        local_4f4 = local_4f4 + (int)((ulong)((long)ppaVar19 - (long)ppaVar22) >> 3);
        (paVar13->mName).length = aVar9;
        strncpy((paVar13->mName).data,__s,0x3ff);
        local_504 = uVar20 + 1;
        pcHeader = local_4e8;
        pvVar23 = local_4f0;
      }
      uVar25 = uVar25 + 1;
    } while (uVar25 < pcHeader->groups_num);
  }
  puVar10 = local_4c8;
  paVar13 = this->pScene->mRootNode;
  if ((paVar13->mNumChildren == 1) && (local_478 == (IntBone_MDL7 **)0x0)) {
    this->pScene->mRootNode = *paVar13->mChildren;
    *paVar13->mChildren = (aiNode *)0x0;
    if (paVar13 != (aiNode *)0x0) {
      aiNode::~aiNode(paVar13);
      operator_delete(paVar13);
    }
    this->pScene->mRootNode->mParent = (aiNode *)0x0;
  }
  else {
    (paVar13->mName).length = 0xb;
    builtin_strncpy((paVar13->mName).data,"<mesh_root>",0xc);
  }
  if (*puVar10 != 0) {
    lVar24 = *puVar10 * 0x18;
    do {
      pvVar6 = *(void **)((long)puVar10 + lVar24 + -0x10);
      if (pvVar6 != (void *)0x0) {
        operator_delete(pvVar6);
      }
      lVar24 = lVar24 + -0x18;
    } while (lVar24 != 0);
  }
  operator_delete__(puVar10);
  operator_delete__(local_4c0);
  CopyMaterials_3DGS_MDL7(this,(IntSharedData_MDL7 *)local_4b8);
  HandleMaterialReferences_3DGS_MDL7(this);
  if (local_478 != (IntBone_MDL7 **)0x0) {
    this_00 = (aiNode *)operator_new(0x478);
    aiNode::aiNode(this_00);
    paVar13 = this->pScene->mRootNode;
    paVar13->mChildren[paVar13->mNumChildren - 1] = this_00;
    (this_00->mName).length = 0xf;
    builtin_strncpy((this_00->mName).data,"<skeleton_root>",0x10);
    AddBonesToNodeGraph_3DGS_MDL7(this,local_478,this_00,0xffff);
    BuildOutputAnims_3DGS_MDL7(this,local_478);
  }
  MDL::IntSharedData_MDL7::~IntSharedData_MDL7((IntSharedData_MDL7 *)local_4b8);
  return;
}

Assistant:

void MDLImporter::InternReadFile_3DGS_MDL7( )
{
    ai_assert(NULL != pScene);

    MDL::IntSharedData_MDL7 sharedData;

    // current cursor position in the file
    BE_NCONST MDL::Header_MDL7 *pcHeader = (BE_NCONST MDL::Header_MDL7*)this->mBuffer;
    const unsigned char* szCurrent = (const unsigned char*)(pcHeader+1);

    AI_SWAP4(pcHeader->version);
    AI_SWAP4(pcHeader->bones_num);
    AI_SWAP4(pcHeader->groups_num);
    AI_SWAP4(pcHeader->data_size);
    AI_SWAP4(pcHeader->entlump_size);
    AI_SWAP4(pcHeader->medlump_size);
    AI_SWAP2(pcHeader->bone_stc_size);
    AI_SWAP2(pcHeader->skin_stc_size);
    AI_SWAP2(pcHeader->colorvalue_stc_size);
    AI_SWAP2(pcHeader->material_stc_size);
    AI_SWAP2(pcHeader->skinpoint_stc_size);
    AI_SWAP2(pcHeader->triangle_stc_size);
    AI_SWAP2(pcHeader->mainvertex_stc_size);
    AI_SWAP2(pcHeader->framevertex_stc_size);
    AI_SWAP2(pcHeader->bonetrans_stc_size);
    AI_SWAP2(pcHeader->frame_stc_size);

    // validate the header of the file. There are some structure
    // sizes that are expected by the loader to be constant
    this->ValidateHeader_3DGS_MDL7(pcHeader);

    // load all bones (they are shared by all groups, so
    // we'll need to add them to all groups/meshes later)
    // apcBonesOut is a list of all bones or NULL if they could not been loaded
    szCurrent += pcHeader->bones_num * pcHeader->bone_stc_size;
    sharedData.apcOutBones = this->LoadBones_3DGS_MDL7();

    // vector to held all created meshes
    std::vector<aiMesh*>* avOutList;

    // 3 meshes per group - that should be OK for most models
    avOutList = new std::vector<aiMesh*>[pcHeader->groups_num];
    for (uint32_t i = 0; i < pcHeader->groups_num;++i)
        avOutList[i].reserve(3);

    // buffer to held the names of all groups in the file
	const size_t buffersize( AI_MDL7_MAX_GROUPNAMESIZE*pcHeader->groups_num );
	char* aszGroupNameBuffer = new char[ buffersize ];

    // read all groups
    for (unsigned int iGroup = 0; iGroup < (unsigned int)pcHeader->groups_num;++iGroup) {
        MDL::IntGroupInfo_MDL7 groupInfo((BE_NCONST MDL::Group_MDL7*)szCurrent,iGroup);
        szCurrent = (const unsigned char*)(groupInfo.pcGroup+1);

        VALIDATE_FILE_SIZE(szCurrent);

        AI_SWAP4(groupInfo.pcGroup->groupdata_size);
        AI_SWAP4(groupInfo.pcGroup->numskins);
        AI_SWAP4(groupInfo.pcGroup->num_stpts);
        AI_SWAP4(groupInfo.pcGroup->numtris);
        AI_SWAP4(groupInfo.pcGroup->numverts);
        AI_SWAP4(groupInfo.pcGroup->numframes);

        if (1 != groupInfo.pcGroup->typ)    {
            // Not a triangle-based mesh
            ASSIMP_LOG_WARN("[3DGS MDL7] Not a triangle mesh group. Continuing happily");
        }

        // store the name of the group
        const unsigned int ofs = iGroup*AI_MDL7_MAX_GROUPNAMESIZE;
        ::memcpy(&aszGroupNameBuffer[ofs],
            groupInfo.pcGroup->name,AI_MDL7_MAX_GROUPNAMESIZE);

        // make sure '\0' is at the end
        aszGroupNameBuffer[ofs+AI_MDL7_MAX_GROUPNAMESIZE-1] = '\0';

        // read all skins
        sharedData.pcMats.reserve(sharedData.pcMats.size() + groupInfo.pcGroup->numskins);
        sharedData.abNeedMaterials.resize(sharedData.abNeedMaterials.size() +
            groupInfo.pcGroup->numskins,false);

        for (unsigned int iSkin = 0; iSkin < (unsigned int)groupInfo.pcGroup->numskins;++iSkin) {
            ParseSkinLump_3DGS_MDL7(szCurrent,&szCurrent,sharedData.pcMats);
        }
        // if we have absolutely no skin loaded we need to generate a default material
        if (sharedData.pcMats.empty())  {
            const int iMode = (int)aiShadingMode_Gouraud;
            sharedData.pcMats.push_back(new aiMaterial());
            aiMaterial* pcHelper = (aiMaterial*)sharedData.pcMats[0];
            pcHelper->AddProperty<int>(&iMode, 1, AI_MATKEY_SHADING_MODEL);

            aiColor3D clr;
            clr.b = clr.g = clr.r = 0.6f;
            pcHelper->AddProperty<aiColor3D>(&clr, 1,AI_MATKEY_COLOR_DIFFUSE);
            pcHelper->AddProperty<aiColor3D>(&clr, 1,AI_MATKEY_COLOR_SPECULAR);

            clr.b = clr.g = clr.r = 0.05f;
            pcHelper->AddProperty<aiColor3D>(&clr, 1,AI_MATKEY_COLOR_AMBIENT);

            aiString szName;
            szName.Set(AI_DEFAULT_MATERIAL_NAME);
            pcHelper->AddProperty(&szName,AI_MATKEY_NAME);

            sharedData.abNeedMaterials.resize(1,false);
        }

        // now get a pointer to all texture coords in the group
        groupInfo.pcGroupUVs = (BE_NCONST MDL::TexCoord_MDL7*)szCurrent;
        for(int i = 0; i < groupInfo.pcGroup->num_stpts; ++i){
            AI_SWAP4(groupInfo.pcGroupUVs[i].u);
            AI_SWAP4(groupInfo.pcGroupUVs[i].v);
        }
        szCurrent += pcHeader->skinpoint_stc_size * groupInfo.pcGroup->num_stpts;

        // now get a pointer to all triangle in the group
        groupInfo.pcGroupTris = (Triangle_MDL7*)szCurrent;
        szCurrent += pcHeader->triangle_stc_size * groupInfo.pcGroup->numtris;

        // now get a pointer to all vertices in the group
        groupInfo.pcGroupVerts = (BE_NCONST MDL::Vertex_MDL7*)szCurrent;
        for(int i = 0; i < groupInfo.pcGroup->numverts; ++i){
            AI_SWAP4(groupInfo.pcGroupVerts[i].x);
            AI_SWAP4(groupInfo.pcGroupVerts[i].y);
            AI_SWAP4(groupInfo.pcGroupVerts[i].z);

            AI_SWAP2(groupInfo.pcGroupVerts[i].vertindex);
            //We can not swap the normal information now as we don't know which of the two kinds it is
        }
        szCurrent += pcHeader->mainvertex_stc_size * groupInfo.pcGroup->numverts;
        VALIDATE_FILE_SIZE(szCurrent);

        MDL::IntSplitGroupData_MDL7 splitGroupData(sharedData,avOutList[iGroup]);
        MDL::IntGroupData_MDL7 groupData;
        if (groupInfo.pcGroup->numtris && groupInfo.pcGroup->numverts)
        {
            // build output vectors
            const unsigned int iNumVertices = groupInfo.pcGroup->numtris*3;
            groupData.vPositions.resize(iNumVertices);
            groupData.vNormals.resize(iNumVertices);

            if (sharedData.apcOutBones)groupData.aiBones.resize(iNumVertices,UINT_MAX);

            // it is also possible that there are 0 UV coordinate sets
            if (groupInfo.pcGroup->num_stpts){
                groupData.vTextureCoords1.resize(iNumVertices,aiVector3D());

                // check whether the triangle data structure is large enough
                // to contain a second UV coordinate set
                if (pcHeader->triangle_stc_size >= AI_MDL7_TRIANGLE_STD_SIZE_TWO_UV)    {
                    groupData.vTextureCoords2.resize(iNumVertices,aiVector3D());
                    groupData.bNeed2UV = true;
                }
            }
            groupData.pcFaces.resize(groupInfo.pcGroup->numtris);

            // read all faces into the preallocated arrays
            ReadFaces_3DGS_MDL7(groupInfo, groupData);

            // sort by materials
            SortByMaterials_3DGS_MDL7(groupInfo, groupData,
                splitGroupData);

            for (unsigned int qq = 0; qq < sharedData.pcMats.size();++qq)   {
                if (!splitGroupData.aiSplit[qq]->empty())
                    sharedData.abNeedMaterials[qq] = true;
            }
        }
        else ASSIMP_LOG_WARN("[3DGS MDL7] Mesh group consists of 0 "
            "vertices or faces. It will be skipped.");

        // process all frames and generate output meshes
        ProcessFrames_3DGS_MDL7(groupInfo,groupData, sharedData,szCurrent,&szCurrent);
        GenerateOutputMeshes_3DGS_MDL7(groupData,splitGroupData);
    }

    // generate a nodegraph and subnodes for each group
    pScene->mRootNode = new aiNode();

    // now we need to build a final mesh list
    for (uint32_t i = 0; i < pcHeader->groups_num;++i)
        pScene->mNumMeshes += (unsigned int)avOutList[i].size();

    pScene->mMeshes = new aiMesh*[pScene->mNumMeshes];  {
        unsigned int p = 0,q = 0;
        for (uint32_t i = 0; i < pcHeader->groups_num;++i)  {
            for (unsigned int a = 0; a < avOutList[i].size();++a)   {
                pScene->mMeshes[p++] = avOutList[i][a];
            }
            if (!avOutList[i].empty())++pScene->mRootNode->mNumChildren;
        }
        // we will later need an extra node to serve as parent for all bones
        if (sharedData.apcOutBones)++pScene->mRootNode->mNumChildren;
        this->pScene->mRootNode->mChildren = new aiNode*[pScene->mRootNode->mNumChildren];
        p = 0;
        for (uint32_t i = 0; i < pcHeader->groups_num;++i)  {
            if (avOutList[i].empty())continue;

            aiNode* const pcNode = pScene->mRootNode->mChildren[p] = new aiNode();
            pcNode->mNumMeshes = (unsigned int)avOutList[i].size();
            pcNode->mMeshes = new unsigned int[pcNode->mNumMeshes];
            pcNode->mParent = this->pScene->mRootNode;
            for (unsigned int a = 0; a < pcNode->mNumMeshes;++a)
                pcNode->mMeshes[a] = q + a;
            q += (unsigned int)avOutList[i].size();

            // setup the name of the node
            char* const szBuffer = &aszGroupNameBuffer[i*AI_MDL7_MAX_GROUPNAMESIZE];
			if ('\0' == *szBuffer) {
				const size_t maxSize(buffersize - (i*AI_MDL7_MAX_GROUPNAMESIZE));
				pcNode->mName.length = ai_snprintf(szBuffer, maxSize, "Group_%u", p);
			} else {
				pcNode->mName.length = ::strlen(szBuffer);
			}
            ::strncpy(pcNode->mName.data,szBuffer,MAXLEN-1);
            ++p;
        }
    }

    // if there is only one root node with a single child we can optimize it a bit ...
    if (1 == pScene->mRootNode->mNumChildren && !sharedData.apcOutBones)    {
        aiNode* pcOldRoot = this->pScene->mRootNode;
        pScene->mRootNode = pcOldRoot->mChildren[0];
        pcOldRoot->mChildren[0] = NULL;
        delete pcOldRoot;
        pScene->mRootNode->mParent = NULL;
    }
    else pScene->mRootNode->mName.Set("<mesh_root>");

    delete[] avOutList;
    delete[] aszGroupNameBuffer;
    AI_DEBUG_INVALIDATE_PTR(avOutList);
    AI_DEBUG_INVALIDATE_PTR(aszGroupNameBuffer);

    // build a final material list.
    CopyMaterials_3DGS_MDL7(sharedData);
    HandleMaterialReferences_3DGS_MDL7();

    // generate output bone animations and add all bones to the scenegraph
    if (sharedData.apcOutBones) {
        // this step adds empty dummy bones to the nodegraph
        // insert another dummy node to avoid name conflicts
        aiNode* const pc = pScene->mRootNode->mChildren[pScene->mRootNode->mNumChildren-1] = new aiNode();

        pc->mName.Set("<skeleton_root>");

        // add bones to the nodegraph
        AddBonesToNodeGraph_3DGS_MDL7((const Assimp::MDL::IntBone_MDL7 **)
            sharedData.apcOutBones,pc,0xffff);

        // this steps build a valid output animation
        BuildOutputAnims_3DGS_MDL7((const Assimp::MDL::IntBone_MDL7 **)
            sharedData.apcOutBones);
    }
}